

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.hpp
# Opt level: O2

void __thiscall
Diligent::FunctionStubHashKey::FunctionStubHashKey
          (FunctionStubHashKey *this,String *_Obj,String *_Func,Uint32 _NumArgs)

{
  HashMapStringKey::HashMapStringKey(&this->Object,_Obj,true);
  HashMapStringKey::HashMapStringKey(&this->Function,_Func,true);
  this->NumArguments = _NumArgs;
  return;
}

Assistant:

FunctionStubHashKey(const String& _Obj,  const String& _Func, Uint32 _NumArgs) :
        Object      {_Obj    },
        Function    {_Func   },
        NumArguments{_NumArgs}
    {
    }